

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldDataFilter.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::MinefieldDataFilter::MinefieldDataFilter
          (MinefieldDataFilter *this,KBOOL GroundBurialDepthOffset,KBOOL WaterBurialDepthOffset,
          KBOOL SnowBurialDepthOffset,KBOOL MineOrientation,KBOOL ThermalContrast,KBOOL Reflectance,
          KBOOL MineEmplacementAge,KBOOL TripDetonationWire,KBOOL Fusing,
          KBOOL ScalarDetectionCoefficient,KBOOL PaintScheme)

{
  KBOOL PaintScheme_local;
  KBOOL ScalarDetectionCoefficient_local;
  KBOOL Fusing_local;
  KBOOL TripDetonationWire_local;
  KBOOL MineEmplacementAge_local;
  KBOOL Reflectance_local;
  KBOOL ThermalContrast_local;
  KBOOL MineOrientation_local;
  KBOOL SnowBurialDepthOffset_local;
  KBOOL WaterBurialDepthOffset_local;
  KBOOL GroundBurialDepthOffset_local;
  MinefieldDataFilter *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__MinefieldDataFilter_00331518;
  (this->m_FilterUnion).m_ui32Filter =
       (this->m_FilterUnion).m_ui32Filter & 0xfffffffe | (uint)GroundBurialDepthOffset;
  (this->m_FilterUnion).m_ui32Filter =
       (this->m_FilterUnion).m_ui32Filter & 0xfffffffd | (uint)WaterBurialDepthOffset << 1;
  (this->m_FilterUnion).m_ui32Filter =
       (this->m_FilterUnion).m_ui32Filter & 0xfffffffb | (uint)SnowBurialDepthOffset << 2;
  (this->m_FilterUnion).m_ui32Filter =
       (this->m_FilterUnion).m_ui32Filter & 0xfffffff7 | (uint)MineOrientation << 3;
  (this->m_FilterUnion).m_ui32Filter =
       (this->m_FilterUnion).m_ui32Filter & 0xffffffef | (uint)ThermalContrast << 4;
  (this->m_FilterUnion).m_ui32Filter =
       (this->m_FilterUnion).m_ui32Filter & 0xffffffdf | (uint)Reflectance << 5;
  (this->m_FilterUnion).m_ui32Filter =
       (this->m_FilterUnion).m_ui32Filter & 0xffffffbf | (uint)MineEmplacementAge << 6;
  (this->m_FilterUnion).m_ui32Filter =
       (this->m_FilterUnion).m_ui32Filter & 0xffffff7f | (uint)TripDetonationWire << 7;
  (this->m_FilterUnion).m_ui32Filter =
       (this->m_FilterUnion).m_ui32Filter & 0xfffffeff | (uint)Fusing << 8;
  (this->m_FilterUnion).m_ui32Filter =
       (this->m_FilterUnion).m_ui32Filter & 0xfffffdff | (uint)ScalarDetectionCoefficient << 9;
  (this->m_FilterUnion).m_ui32Filter =
       (this->m_FilterUnion).m_ui32Filter & 0xfffffbff | (uint)PaintScheme << 10;
  (this->m_FilterUnion).m_ui32Filter = (this->m_FilterUnion).m_ui32Filter & 0x7ff;
  return;
}

Assistant:

MinefieldDataFilter::MinefieldDataFilter( KBOOL GroundBurialDepthOffset, KBOOL WaterBurialDepthOffset, KBOOL SnowBurialDepthOffset,
        KBOOL MineOrientation, KBOOL ThermalContrast, KBOOL Reflectance, KBOOL MineEmplacementAge,
        KBOOL TripDetonationWire, KBOOL Fusing, KBOOL ScalarDetectionCoefficient, KBOOL PaintScheme )
{
    m_FilterUnion.m_ui32GroundOffset = GroundBurialDepthOffset;
    m_FilterUnion.m_ui32WaterOffset  = WaterBurialDepthOffset;
    m_FilterUnion.m_ui32SnowOffset   = SnowBurialDepthOffset;
    m_FilterUnion.m_ui32MineOri      = MineOrientation;
    m_FilterUnion.m_ui32ThermalCon   = ThermalContrast;
    m_FilterUnion.m_ui32Reflectance  = Reflectance;
    m_FilterUnion.m_ui32MineEmpAge   = MineEmplacementAge;
    m_FilterUnion.m_ui32TripDetWire  = TripDetonationWire;
    m_FilterUnion.m_ui32Fusing       = Fusing;
    m_FilterUnion.m_ui32ScalarDet    = ScalarDetectionCoefficient;
    m_FilterUnion.m_ui32PaintScm     = PaintScheme;
    m_FilterUnion.m_ui32Padding      = 0;
}